

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsReceiveQueue.cpp
# Opt level: O0

void __thiscall Scs::ReceiveQueue::Push(ReceiveQueue *this,void *data,size_t bytes)

{
  size_t sVar1;
  bool bVar2;
  element_type *peVar3;
  size_type sVar4;
  vector<unsigned_char,Scs::Allocator<unsigned_char>> *this_00;
  shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_> local_90;
  uchar *local_80;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>
  local_78;
  const_iterator local_70;
  ulong local_68;
  unsigned_long maxBytes;
  size_t bytesToWrite;
  undefined4 local_48;
  MessageHeader local_38;
  MessageHeader header;
  uint8_t *dataBytes;
  lock_guard<std::mutex> lock;
  size_t bytes_local;
  void *data_local;
  ReceiveQueue *this_local;
  
  lock._M_device = (mutex_type *)bytes;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&dataBytes,&this->m_mutex);
  header = (MessageHeader)data;
  do {
    do {
      if (lock._M_device == (mutex_type *)0x0) {
LAB_00125eee:
        local_48 = 0;
LAB_00125ef5:
        std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&dataBytes);
        return;
      }
      if (this->m_messageSize == 0) {
        if (lock._M_device < (mutex_type *)0x8) {
          __assert_fail("bytes >= sizeof(MessageHeader)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JamesBoer[P]Scs/Source/ScsReceiveQueue.cpp"
                        ,0x31,"void Scs::ReceiveQueue::Push(const void *, size_t)");
        }
        MessageHeader::MessageHeader(&local_38);
        local_38 = *data;
        if (local_38.magic != 0x6d736373) {
          LogWriteLine("Transmission error.  Magic header mismatch.");
          local_48 = 1;
          goto LAB_00125ef5;
        }
        this->m_messageSize = (ulong)local_38 >> 0x20;
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_receiveBuffer);
        if (!bVar2) {
          CreateBuffer();
          std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>::operator=
                    (&this->m_receiveBuffer,
                     (shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_> *)
                     &bytesToWrite);
          std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>::~shared_ptr
                    ((shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_> *)
                     &bytesToWrite);
        }
        peVar3 = std::
                 __shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->m_receiveBuffer);
        std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::clear(peVar3);
        lock._M_device =
             (mutex_type *)((long)&lock._M_device[-1].super___mutex_base._M_mutex + 0x20);
        header = (MessageHeader)((long)header + 8);
      }
      maxBytes = (unsigned_long)lock._M_device;
      sVar1 = this->m_messageSize;
      peVar3 = std::
               __shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m_receiveBuffer);
      sVar4 = std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::size(peVar3);
      local_68 = sVar1 - sVar4;
      if (local_68 < maxBytes) {
        maxBytes = local_68;
      }
      this_00 = (vector<unsigned_char,Scs::Allocator<unsigned_char>> *)
                std::
                __shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->m_receiveBuffer);
      peVar3 = std::
               __shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m_receiveBuffer);
      local_78._M_current =
           (uchar *)std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::end(peVar3);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,Scs::Allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,Scs::Allocator<unsigned_char>>>
                  *)&local_70,&local_78);
      local_80 = (uchar *)std::vector<unsigned_char,Scs::Allocator<unsigned_char>>::
                          insert<unsigned_char_const*,void>
                                    (this_00,local_70,(uchar *)header,
                                     (uchar *)((long)header + maxBytes));
      if (lock._M_device < maxBytes) {
        __assert_fail("bytesToWrite <= bytes",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JamesBoer[P]Scs/Source/ScsReceiveQueue.cpp"
                      ,0x49,"void Scs::ReceiveQueue::Push(const void *, size_t)");
      }
      lock._M_device = (mutex_type *)((long)lock._M_device - maxBytes);
      header = (MessageHeader)(maxBytes + (long)header);
      peVar3 = std::
               __shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m_receiveBuffer);
      sVar4 = std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::size(peVar3);
    } while (sVar4 < this->m_messageSize);
    peVar3 = std::
             __shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_receiveBuffer);
    sVar4 = std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::size(peVar3);
    if (this->m_messageSize < sVar4) {
      LogWriteLine("Transmission error.  Message exceeds expected size.");
      goto LAB_00125eee;
    }
    std::
    queue<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_std::deque<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>_>
    ::push(&this->m_queue,&this->m_receiveBuffer);
    std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>::shared_ptr
              (&local_90,(nullptr_t)0x0);
    std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>::operator=
              (&this->m_receiveBuffer,&local_90);
    std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>::~shared_ptr
              (&local_90);
    this->m_messageSize = 0;
  } while( true );
}

Assistant:

void ReceiveQueue::Push(const void * data, size_t bytes)
{
	std::lock_guard<std::mutex> lock(m_mutex);
	const uint8_t * dataBytes = static_cast<const uint8_t *>(data);
	while (bytes)
	{
		// Check to see if this is a new message, and if so, prepare the buffer and write out the header structure
		if (m_messageSize == 0)
		{
			assert(bytes >= sizeof(MessageHeader));
			MessageHeader header;
			memcpy(&header, data, sizeof(MessageHeader));
			if (header.magic != MAGIC_HEADER_VAL)
			{
				LogWriteLine("Transmission error.  Magic header mismatch.");
				return;
			}
			m_messageSize = header.size;
			if (!m_receiveBuffer)
				m_receiveBuffer = CreateBuffer();
			m_receiveBuffer->clear();
			bytes -= sizeof(MessageHeader);
			dataBytes += sizeof(MessageHeader);
		}

		// Don't write out more than the message size yet
		auto bytesToWrite = bytes;
		auto maxBytes = m_messageSize - m_receiveBuffer->size();
		if (bytesToWrite > maxBytes)
			bytesToWrite = maxBytes;

		// Write data into the receive buffer and update our counts
		m_receiveBuffer->insert(m_receiveBuffer->end(), dataBytes, dataBytes + bytesToWrite);
		assert(bytesToWrite <= bytes);
		bytes -= bytesToWrite;
		dataBytes += bytesToWrite;

		if (m_receiveBuffer->size() >= m_messageSize)
		{
			if (m_receiveBuffer->size() > m_messageSize)
			{
				LogWriteLine("Transmission error.  Message exceeds expected size.");
				break;
			}
			else
			{
				m_queue.push(m_receiveBuffer);
			}
			m_receiveBuffer = nullptr;
			m_messageSize = 0;
		}
	}
}